

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

Label __thiscall asmjit::CodeBuilder::newLabel(CodeBuilder *this)

{
  Error EVar1;
  undefined8 *puVar2;
  CBLabel *in_RSI;
  CodeEmitter *in_RDI;
  Label LVar3;
  Error err;
  CBLabel *node;
  uint32_t id;
  size_t allocatedSize;
  char *in_stack_000002c0;
  int in_stack_000002cc;
  char *in_stack_000002d0;
  CBJump **ppCVar4;
  CodeEmitter *this_00;
  CBLabel *node_00;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 local_ec;
  size_t *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ZoneHeap *in_stack_ffffffffffffff68;
  Error error;
  
  local_ec = 0xffffffff;
  this_00 = in_RDI;
  if (in_RSI->_numRefs == 0) {
    ppCVar4 = &in_RSI[3]._from;
    if (*ppCVar4 == (CBJump *)0x0) {
      DebugUtils::assertionFailed(in_stack_000002d0,in_stack_000002cc,in_stack_000002c0);
    }
    node_00 = in_RSI;
    puVar2 = (undefined8 *)
             ZoneHeap::_alloc(in_stack_ffffffffffffff68,
                              CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                              in_stack_ffffffffffffff58);
    error = (Error)((ulong)ppCVar4 >> 0x20);
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 4;
    *(undefined1 *)((long)puVar2 + 0x11) = 0;
    *(short *)((long)puVar2 + 0x12) = (short)*(undefined4 *)((long)&in_RSI[6]._from + 4);
    *(undefined4 *)((long)puVar2 + 0x14) = *(undefined4 *)&in_RSI[6]._from;
    puVar2[3] = 0;
    puVar2[4] = 0;
    *(undefined4 *)(puVar2 + 5) = 0xffffffff;
    *(undefined4 *)((long)puVar2 + 0x2c) = 0;
    puVar2[6] = 0;
    if (puVar2 == (undefined8 *)0x0) {
      CodeEmitter::setLastError(this_00,error,(char *)in_RSI);
    }
    else {
      EVar1 = registerLabelNode((CodeBuilder *)
                                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                node_00);
      if (EVar1 == 0) {
        local_ec = *(undefined4 *)(puVar2 + 5);
      }
      else {
        CodeEmitter::setLastError(this_00,error,(char *)in_RSI);
      }
    }
  }
  this_00->_vptr_CodeEmitter = (_func_int **)CONCAT44(local_ec,4);
  (this_00->_codeInfo)._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this_00->_codeInfo).field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  LVar3.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)0x0;
  LVar3.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)in_RDI;
  return (Label)LVar3.super_Operand.super_Operand_.field_0;
}

Assistant:

Label CodeBuilder::newLabel() {
  uint32_t id = kInvalidValue;

  if (!_lastError) {
    CBLabel* node = newNodeT<CBLabel>(id);
    if (ASMJIT_UNLIKELY(!node)) {
      setLastError(DebugUtils::errored(kErrorNoHeapMemory));
    }
    else {
      Error err = registerLabelNode(node);
      if (ASMJIT_UNLIKELY(err))
        setLastError(err);
      else
        id = node->getId();
    }
  }

  return Label(id);
}